

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_bcread.c
# Opt level: O3

void bcread_ktabk(LexState *ls,TValue *o)

{
  char **pp;
  char *str;
  uint32_t uVar1;
  GCstr *pGVar2;
  
  pp = &ls->p;
  uVar1 = lj_buf_ruleb128(pp);
  if (uVar1 < 5) {
    if (uVar1 == 4) {
      uVar1 = lj_buf_ruleb128(pp);
      (o->u32).lo = uVar1;
      uVar1 = lj_buf_ruleb128(pp);
      (o->field_2).it = uVar1;
    }
    else if (uVar1 == 3) {
      uVar1 = lj_buf_ruleb128(pp);
      o->n = (double)(int)uVar1;
    }
    else {
      (o->field_2).it = ~uVar1;
    }
  }
  else {
    str = ls->p;
    ls->p = str + (uVar1 - 5);
    pGVar2 = lj_str_new(ls->L,str,(ulong)(uVar1 - 5));
    (o->u32).lo = (uint32_t)pGVar2;
    (o->field_2).it = 0xfffffffb;
  }
  return;
}

Assistant:

static void bcread_ktabk(LexState *ls, TValue *o)
{
  MSize tp = bcread_uleb128(ls);
  if (tp >= BCDUMP_KTAB_STR) {
    MSize len = tp - BCDUMP_KTAB_STR;
    const char *p = (const char *)bcread_mem(ls, len);
    setstrV(ls->L, o, lj_str_new(ls->L, p, len));
  } else if (tp == BCDUMP_KTAB_INT) {
    setintV(o, (int32_t)bcread_uleb128(ls));
  } else if (tp == BCDUMP_KTAB_NUM) {
    o->u32.lo = bcread_uleb128(ls);
    o->u32.hi = bcread_uleb128(ls);
  } else {
    lj_assertLS(tp <= BCDUMP_KTAB_TRUE, "bad constant type %d", tp);
    setpriV(o, ~tp);
  }
}